

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.h
# Opt level: O2

void CDiskBlockIndex::SerializationOps<DataStream,CDiskBlockIndex_const,ActionSerialize>
               (long obj,DataStream *s)

{
  uint *puVar1;
  uint uVar2;
  long in_FS_OFFSET;
  int _nVersion;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock0;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_int_&> local_40;
  uint local_34;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_30,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h",
             0x17b,false);
  local_40.m_object = &local_34;
  local_34 = 0x3f73c;
  Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&> *)&local_40,s);
  local_40.m_object = (uint *)(obj + 0x18);
  Wrapper<VarIntFormatter<(VarIntMode)1>,_const_int_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)1>,_const_int_&> *)&local_40,s);
  puVar1 = (uint *)(obj + 0x58);
  local_40.m_object = puVar1;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_int_&>::Serialize<DataStream>(&local_40,s);
  local_40.m_object = (uint *)(obj + 0x48);
  Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_int_&>::Serialize<DataStream>(&local_40,s);
  uVar2 = *puVar1;
  if ((uVar2 & 0x18) != 0) {
    local_40.m_object = (uint *)(obj + 0x1c);
    Wrapper<VarIntFormatter<(VarIntMode)1>,_const_int_&>::Serialize<DataStream>
              ((Wrapper<VarIntFormatter<(VarIntMode)1>,_const_int_&> *)&local_40,s);
    uVar2 = *puVar1;
  }
  if ((uVar2 & 8) != 0) {
    local_40.m_object = (uint *)(obj + 0x20);
    Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_int_&>::Serialize<DataStream>
              (&local_40,s);
    uVar2 = *puVar1;
  }
  if ((uVar2 & 0x10) != 0) {
    local_40.m_object = (uint *)(obj + 0x24);
    Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_int_&>::Serialize<DataStream>
              (&local_40,s);
  }
  SerializeMany<DataStream,int>(s,(int *)(obj + 0x5c));
  base_blob<256U>::Serialize<DataStream>((base_blob<256U> *)(obj + 0x94),s);
  base_blob<256U>::Serialize<DataStream>((base_blob<256U> *)(obj + 0x60),s);
  SerializeMany<DataStream,unsigned_int>(s,(uint *)(obj + 0x80));
  SerializeMany<DataStream,unsigned_int>(s,(uint *)(obj + 0x84));
  SerializeMany<DataStream,unsigned_int>(s,(uint *)(obj + 0x88));
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CDiskBlockIndex, obj)
    {
        LOCK(::cs_main);
        int _nVersion = DUMMY_VERSION;
        READWRITE(VARINT_MODE(_nVersion, VarIntMode::NONNEGATIVE_SIGNED));

        READWRITE(VARINT_MODE(obj.nHeight, VarIntMode::NONNEGATIVE_SIGNED));
        READWRITE(VARINT(obj.nStatus));
        READWRITE(VARINT(obj.nTx));
        if (obj.nStatus & (BLOCK_HAVE_DATA | BLOCK_HAVE_UNDO)) READWRITE(VARINT_MODE(obj.nFile, VarIntMode::NONNEGATIVE_SIGNED));
        if (obj.nStatus & BLOCK_HAVE_DATA) READWRITE(VARINT(obj.nDataPos));
        if (obj.nStatus & BLOCK_HAVE_UNDO) READWRITE(VARINT(obj.nUndoPos));

        // block header
        READWRITE(obj.nVersion);
        READWRITE(obj.hashPrev);
        READWRITE(obj.hashMerkleRoot);
        READWRITE(obj.nTime);
        READWRITE(obj.nBits);
        READWRITE(obj.nNonce);
    }